

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

int Llb_ManCutPiNum(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  int iVar1;
  Aig_Obj_t *pObj;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < vMinCut->nSize; i = i + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(vMinCut,i);
    iVar1 = Saig_ObjIsPi(p,pObj);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Llb_ManCutPiNum( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
        if ( Saig_ObjIsPi(p,pObj) )
            Counter++;
    return Counter;
}